

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  undefined8 uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  int iVar12;
  uint uVar13;
  __m128i *palVar14;
  ulong uVar15;
  longlong extraout_RDX;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong size;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  undefined4 uVar31;
  ushort uVar50;
  ushort uVar53;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar33 [16];
  undefined4 uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i alVar37;
  ushort uVar47;
  ushort uVar59;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar48;
  short sVar51;
  short sVar54;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar49;
  ushort uVar52;
  ushort uVar55;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar60;
  uint uVar62;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar63 [16];
  ushort uVar67;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ushort uVar74;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  undefined1 auVar75 [16];
  undefined1 auVar83 [16];
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  ushort uVar89;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  undefined1 auVar90 [16];
  undefined1 auVar98 [16];
  ushort uVar99;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  undefined1 auVar100 [16];
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  __m128i c;
  uint local_1b4;
  int local_194;
  ushort local_148;
  ushort uStack_146;
  ushort local_c8;
  ushort uStack_c6;
  ushort local_78;
  ushort uStack_76;
  size_t len;
  undefined1 auVar40 [16];
  short sVar61;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar62 = profile->s1Len;
        uVar15 = (ulong)uVar62;
        if ((int)uVar62 < 1) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse2_128_16_cold_1();
        }
        else {
          uVar19 = uVar15 + 7;
          iVar9 = -open;
          iVar12 = ppVar5->min;
          iVar21 = -iVar12;
          if (iVar12 != iVar9 && SBORROW4(iVar12,iVar9) == iVar12 + open < 0) {
            iVar21 = open;
          }
          iVar8 = ppVar5->max;
          uVar26 = (uint)uVar19 & 0x7ffffff8;
          ppVar11 = parasail_result_new_table1(uVar26,s2Len);
          if (ppVar11 != (parasail_result_t *)0x0) {
            size = uVar19 >> 3;
            ppVar11->flag = ppVar11->flag | 0x8220404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            auVar33._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar33._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar33._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar33._12_4_ = -(uint)((int)__dest == 0 && (int)((ulong)__dest >> 0x20) == 0);
            iVar12 = movmskps(iVar12,auVar33);
            if (iVar12 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar33 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar31 = auVar33._0_4_;
            auVar33 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar32 = auVar33._0_4_;
            local_1b4 = iVar21 - 0x7fff;
            auVar33 = pshuflw(ZEXT416(local_1b4),ZEXT416(local_1b4),0);
            auVar34 = ZEXT416(CONCAT22((short)((uint)iVar9 >> 0x10),0x7ffe - (short)iVar8));
            auVar35 = pshuflw(auVar34,auVar34,0);
            uVar10 = local_1b4 & 0xffff;
            uVar25 = (uint)size;
            uVar13 = -(gap * uVar25);
            len = (size_t)uVar13;
            auVar34 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0);
            uVar13 = auVar34._0_4_;
            auVar36._0_8_ = CONCAT44(uVar13,uVar13);
            auVar36._8_4_ = uVar13;
            auVar36._12_4_ = uVar13;
            auVar72._0_8_ = auVar36._0_8_ << 0x10;
            auVar72._8_8_ = auVar36._8_8_ << 0x10 | (ulong)(uVar13 >> 0x10);
            auVar36 = paddsw(auVar72,ZEXT416(uVar10));
            alVar37[1] = (longlong)b;
            alVar37[0] = size;
            parasail_memset___m128i(b_00,alVar37,len);
            c[1] = extraout_RDX;
            c[0] = size;
            parasail_memset___m128i(b,c,len);
            auVar34._4_4_ = uVar32;
            auVar34._0_4_ = uVar32;
            auVar34._8_4_ = uVar32;
            auVar34._12_4_ = uVar32;
            auVar83._4_4_ = uVar31;
            auVar83._0_4_ = uVar31;
            auVar83._8_4_ = uVar31;
            auVar83._12_4_ = uVar31;
            alVar37 = (__m128i)psubsw((undefined1  [16])0x0,auVar83);
            palVar14 = ptr_00 + (uVar25 - 1);
            uVar16 = size;
            do {
              *palVar14 = alVar37;
              alVar37 = (__m128i)psubsw((undefined1  [16])alVar37,auVar34);
              palVar14 = palVar14 + -1;
              iVar12 = (int)uVar16;
              uVar13 = iVar12 - 1;
              uVar16 = (ulong)uVar13;
            } while (uVar13 != 0 && 0 < iVar12);
            uVar16 = (ulong)(uint)s2Len;
            lVar20 = (ulong)(uVar25 + (uVar25 == 0)) << 4;
            lVar23 = size * uVar16;
            lVar24 = 0;
            uVar22 = 0;
            local_148 = auVar33._0_2_;
            uStack_146 = auVar33._2_2_;
            local_c8 = auVar35._0_2_;
            uStack_c6 = auVar35._2_2_;
            local_194 = 0;
            uVar89 = local_148;
            uVar91 = uStack_146;
            uVar92 = local_148;
            uVar93 = uStack_146;
            uVar94 = local_148;
            uVar95 = uStack_146;
            uVar96 = local_148;
            uVar97 = uStack_146;
            uVar99 = local_148;
            uVar101 = uStack_146;
            uVar102 = local_148;
            uVar103 = uStack_146;
            uVar104 = local_148;
            uVar105 = uStack_146;
            uVar106 = local_148;
            uVar107 = uStack_146;
            local_78 = local_148;
            uStack_76 = uStack_146;
            uVar30 = local_148;
            uVar49 = uStack_146;
            uVar52 = local_148;
            uVar55 = uStack_146;
            uVar70 = local_148;
            uVar71 = uStack_146;
            uVar108 = local_c8;
            uVar109 = uStack_c6;
            uVar110 = local_c8;
            uVar111 = uStack_c6;
            uVar112 = local_c8;
            uVar113 = uStack_c6;
            uVar114 = local_c8;
            uVar115 = uStack_c6;
            do {
              iVar12 = ppVar5->mapper[(byte)s2[uVar22]];
              uVar7 = b_00[uVar25 - 1][0];
              auVar35._0_8_ = uVar7 << 0x10;
              auVar35._8_8_ = b_00[uVar25 - 1][1] << 0x10 | uVar7 >> 0x30;
              lVar17 = 0;
              auVar63 = (undefined1  [16])0x0;
              uVar28 = local_148;
              uVar47 = uStack_146;
              uVar50 = local_148;
              uVar53 = uStack_146;
              uVar56 = local_148;
              uVar57 = uStack_146;
              uVar58 = local_148;
              uVar59 = uStack_146;
              do {
                auVar33 = *(undefined1 (*) [16])((long)*b_00 + lVar17);
                auVar72 = paddsw(auVar35,*(undefined1 (*) [16])
                                          ((long)pvVar4 + lVar17 + (long)iVar12 * size * 0x10));
                auVar35 = paddsw(auVar63,*(undefined1 (*) [16])((long)*ptr_00 + lVar17));
                auVar63 = psubsw(*(undefined1 (*) [16])((long)*b + lVar17),auVar34);
                sVar61 = auVar35._0_2_;
                uVar28 = (ushort)((short)uVar28 < sVar61) * sVar61 |
                         ((short)uVar28 >= sVar61) * uVar28;
                sVar61 = auVar35._2_2_;
                uVar47 = (ushort)((short)uVar47 < sVar61) * sVar61 |
                         ((short)uVar47 >= sVar61) * uVar47;
                sVar61 = auVar35._4_2_;
                uVar50 = (ushort)((short)uVar50 < sVar61) * sVar61 |
                         ((short)uVar50 >= sVar61) * uVar50;
                sVar61 = auVar35._6_2_;
                uVar53 = (ushort)((short)uVar53 < sVar61) * sVar61 |
                         ((short)uVar53 >= sVar61) * uVar53;
                sVar61 = auVar35._8_2_;
                uVar56 = (ushort)((short)uVar56 < sVar61) * sVar61 |
                         ((short)uVar56 >= sVar61) * uVar56;
                sVar61 = auVar35._10_2_;
                uVar57 = (ushort)((short)uVar57 < sVar61) * sVar61 |
                         ((short)uVar57 >= sVar61) * uVar57;
                sVar61 = auVar35._12_2_;
                uVar58 = (ushort)((short)uVar58 < sVar61) * sVar61 |
                         ((short)uVar58 >= sVar61) * uVar58;
                sVar61 = auVar35._14_2_;
                uVar59 = (ushort)((short)uVar59 < sVar61) * sVar61 |
                         ((short)uVar59 >= sVar61) * uVar59;
                auVar35 = psubsw(auVar33,auVar83);
                sVar61 = auVar63._0_2_;
                sVar85 = auVar35._0_2_;
                uVar74 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._2_2_;
                sVar85 = auVar35._2_2_;
                uVar76 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._4_2_;
                sVar85 = auVar35._4_2_;
                uVar77 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._6_2_;
                sVar85 = auVar35._6_2_;
                uVar78 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._8_2_;
                sVar85 = auVar35._8_2_;
                uVar79 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._10_2_;
                sVar85 = auVar35._10_2_;
                uVar80 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._12_2_;
                sVar85 = auVar35._12_2_;
                sVar86 = auVar35._14_2_;
                uVar81 = (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar63._14_2_;
                uVar82 = (ushort)(sVar86 < sVar61) * sVar61 | (ushort)(sVar86 >= sVar61) * sVar86;
                sVar61 = auVar72._0_2_;
                uVar60 = (sVar61 < (short)uVar74) * uVar74 |
                         (ushort)(sVar61 >= (short)uVar74) * sVar61;
                sVar61 = auVar72._2_2_;
                uVar67 = (sVar61 < (short)uVar76) * uVar76 |
                         (ushort)(sVar61 >= (short)uVar76) * sVar61;
                sVar61 = auVar72._4_2_;
                uVar68 = (sVar61 < (short)uVar77) * uVar77 |
                         (ushort)(sVar61 >= (short)uVar77) * sVar61;
                sVar61 = auVar72._6_2_;
                uVar69 = (sVar61 < (short)uVar78) * uVar78 |
                         (ushort)(sVar61 >= (short)uVar78) * sVar61;
                auVar63._0_8_ = CONCAT26(uVar69,CONCAT24(uVar68,CONCAT22(uVar67,uVar60)));
                sVar61 = auVar72._8_2_;
                auVar63._8_2_ =
                     (sVar61 < (short)uVar79) * uVar79 | (ushort)(sVar61 >= (short)uVar79) * sVar61;
                sVar61 = auVar72._10_2_;
                auVar63._10_2_ =
                     (sVar61 < (short)uVar80) * uVar80 | (ushort)(sVar61 >= (short)uVar80) * sVar61;
                sVar61 = auVar72._12_2_;
                sVar85 = auVar72._14_2_;
                auVar63._12_2_ =
                     (sVar61 < (short)uVar81) * uVar81 | (ushort)(sVar61 >= (short)uVar81) * sVar61;
                auVar63._14_2_ =
                     (sVar85 < (short)uVar82) * uVar82 | (ushort)(sVar85 >= (short)uVar82) * sVar85;
                puVar1 = (ushort *)((long)*b + lVar17);
                *puVar1 = uVar74;
                puVar1[1] = uVar76;
                puVar1[2] = uVar77;
                puVar1[3] = uVar78;
                puVar1[4] = uVar79;
                puVar1[5] = uVar80;
                puVar1[6] = uVar81;
                puVar1[7] = uVar82;
                *(undefined1 (*) [16])((long)*ptr + lVar17) = auVar63;
                lVar17 = lVar17 + 0x10;
                auVar35 = auVar33;
              } while (lVar20 != lVar17);
              auVar64._0_8_ = auVar63._0_8_ << 0x10;
              auVar64._8_8_ = auVar63._8_8_ << 0x10 | (ulong)uVar69;
              auVar33 = paddsw((undefined1  [16])*ptr_00,auVar64);
              sVar61 = auVar33._0_2_;
              auVar38._0_2_ =
                   (ushort)((short)uVar28 < sVar61) * sVar61 | ((short)uVar28 >= sVar61) * uVar28;
              sVar61 = auVar33._2_2_;
              auVar38._2_2_ =
                   (ushort)((short)uVar47 < sVar61) * sVar61 | ((short)uVar47 >= sVar61) * uVar47;
              sVar61 = auVar33._4_2_;
              auVar38._4_2_ =
                   (ushort)((short)uVar50 < sVar61) * sVar61 | ((short)uVar50 >= sVar61) * uVar50;
              sVar61 = auVar33._6_2_;
              auVar38._6_2_ =
                   (ushort)((short)uVar53 < sVar61) * sVar61 | ((short)uVar53 >= sVar61) * uVar53;
              sVar61 = auVar33._8_2_;
              auVar38._8_2_ =
                   (ushort)((short)uVar56 < sVar61) * sVar61 | ((short)uVar56 >= sVar61) * uVar56;
              sVar61 = auVar33._10_2_;
              auVar38._10_2_ =
                   (ushort)((short)uVar57 < sVar61) * sVar61 | ((short)uVar57 >= sVar61) * uVar57;
              sVar61 = auVar33._12_2_;
              auVar38._12_2_ =
                   (ushort)((short)uVar58 < sVar61) * sVar61 | ((short)uVar58 >= sVar61) * uVar58;
              sVar61 = auVar33._14_2_;
              auVar38._14_2_ =
                   (ushort)((short)uVar59 < sVar61) * sVar61 | ((short)uVar59 >= sVar61) * uVar59;
              iVar12 = 6;
              do {
                auVar39._0_8_ = auVar38._0_8_ << 0x10;
                auVar39._8_8_ = auVar38._8_8_ << 0x10 | auVar38._0_8_ >> 0x30;
                auVar33 = paddsw(auVar39,auVar36);
                sVar61 = auVar38._0_2_;
                sVar29 = auVar33._0_2_;
                sVar85 = auVar38._2_2_;
                sVar48 = auVar33._2_2_;
                sVar86 = auVar38._4_2_;
                sVar51 = auVar33._4_2_;
                sVar87 = auVar38._6_2_;
                sVar54 = auVar33._6_2_;
                uVar28 = (ushort)(sVar54 < sVar87) * sVar87 | (ushort)(sVar54 >= sVar87) * sVar54;
                auVar40._0_8_ =
                     CONCAT26(uVar28,CONCAT24((ushort)(sVar51 < sVar86) * sVar86 |
                                              (ushort)(sVar51 >= sVar86) * sVar51,
                                              CONCAT22((ushort)(sVar48 < sVar85) * sVar85 |
                                                       (ushort)(sVar48 >= sVar85) * sVar48,
                                                       (ushort)(sVar29 < sVar61) * sVar61 |
                                                       (ushort)(sVar29 >= sVar61) * sVar29)));
                sVar61 = auVar38._8_2_;
                sVar85 = auVar33._8_2_;
                auVar40._8_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar38._10_2_;
                sVar85 = auVar33._10_2_;
                auVar40._10_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar38._12_2_;
                sVar85 = auVar33._12_2_;
                sVar86 = auVar33._14_2_;
                auVar40._12_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar38._14_2_;
                auVar40._14_2_ =
                     (ushort)(sVar86 < sVar61) * sVar61 | (ushort)(sVar86 >= sVar61) * sVar86;
                iVar12 = iVar12 + -1;
                auVar38 = auVar40;
              } while (iVar12 != 0);
              auVar41._0_8_ = auVar40._0_8_ << 0x10;
              auVar41._8_8_ = auVar40._8_8_ << 0x10 | (ulong)uVar28;
              auVar42 = paddsw(auVar41,ZEXT416(uVar10));
              sVar29 = (-1 < (short)uVar60) * uVar60;
              sVar51 = (-1 < (short)uVar67) * uVar67;
              sVar48 = (-1 < auVar64._0_8_) * uVar68;
              sVar87 = (-1 < (short)uVar69) * uVar69;
              sVar86 = (-1 < (short)auVar63._8_2_) * auVar63._8_2_;
              sVar61 = (-1 < (short)auVar63._10_2_) * auVar63._10_2_;
              sVar85 = (-1 < (long)auVar64._8_8_) * auVar63._12_2_;
              sVar54 = auVar42._2_2_;
              auVar65._2_2_ =
                   (ushort)(sVar29 < sVar54) * sVar54 | (ushort)(sVar29 >= sVar54) * sVar29;
              auVar65._0_2_ = (ushort)(0 < auVar42._0_2_) * auVar42._0_2_;
              sVar29 = auVar42._4_2_;
              auVar65._4_2_ =
                   (ushort)(sVar51 < sVar29) * sVar29 | (ushort)(sVar51 >= sVar29) * sVar51;
              sVar29 = auVar42._6_2_;
              auVar65._6_2_ =
                   (ushort)(sVar48 < sVar29) * sVar29 | (ushort)(sVar48 >= sVar29) * sVar48;
              sVar29 = auVar42._8_2_;
              auVar65._8_2_ =
                   (ushort)(sVar87 < sVar29) * sVar29 | (ushort)(sVar87 >= sVar29) * sVar87;
              sVar87 = auVar42._10_2_;
              auVar65._10_2_ =
                   (ushort)(sVar86 < sVar87) * sVar87 | (ushort)(sVar86 >= sVar87) * sVar86;
              sVar86 = auVar42._12_2_;
              auVar65._12_2_ =
                   (ushort)(sVar61 < sVar86) * sVar86 | (ushort)(sVar61 >= sVar86) * sVar61;
              sVar61 = auVar42._14_2_;
              auVar65._14_2_ =
                   (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
              lVar18 = 0;
              lVar17 = lVar24;
              do {
                auVar33 = psubsw(auVar42,auVar34);
                auVar35 = psubsw(auVar65,auVar83);
                sVar61 = auVar35._0_2_;
                sVar85 = auVar33._0_2_;
                auVar42._0_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._2_2_;
                sVar85 = auVar33._2_2_;
                auVar42._2_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._4_2_;
                sVar85 = auVar33._4_2_;
                auVar42._4_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._6_2_;
                sVar85 = auVar33._6_2_;
                auVar42._6_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._8_2_;
                sVar85 = auVar33._8_2_;
                auVar42._8_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._10_2_;
                sVar85 = auVar33._10_2_;
                auVar42._10_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._12_2_;
                sVar85 = auVar33._12_2_;
                sVar86 = auVar33._14_2_;
                auVar42._12_2_ =
                     (ushort)(sVar85 < sVar61) * sVar61 | (ushort)(sVar85 >= sVar61) * sVar85;
                sVar61 = auVar35._14_2_;
                auVar42._14_2_ =
                     (ushort)(sVar86 < sVar61) * sVar61 | (ushort)(sVar86 >= sVar61) * sVar86;
                psVar2 = (short *)((long)*ptr + lVar18);
                sVar61 = *psVar2;
                sVar85 = psVar2[1];
                sVar86 = psVar2[2];
                sVar87 = psVar2[3];
                sVar29 = psVar2[4];
                sVar48 = psVar2[5];
                sVar51 = psVar2[6];
                sVar54 = psVar2[7];
                uVar47 = (sVar61 < (short)auVar42._0_2_) * auVar42._0_2_ |
                         (ushort)(sVar61 >= (short)auVar42._0_2_) * sVar61;
                uVar50 = (sVar85 < (short)auVar42._2_2_) * auVar42._2_2_ |
                         (ushort)(sVar85 >= (short)auVar42._2_2_) * sVar85;
                uVar53 = (sVar86 < (short)auVar42._4_2_) * auVar42._4_2_ |
                         (ushort)(sVar86 >= (short)auVar42._4_2_) * sVar86;
                uVar56 = (sVar87 < (short)auVar42._6_2_) * auVar42._6_2_ |
                         (ushort)(sVar87 >= (short)auVar42._6_2_) * sVar87;
                uVar28 = (sVar29 < (short)auVar42._8_2_) * auVar42._8_2_ |
                         (ushort)(sVar29 >= (short)auVar42._8_2_) * sVar29;
                uVar59 = (sVar48 < (short)auVar42._10_2_) * auVar42._10_2_ |
                         (ushort)(sVar48 >= (short)auVar42._10_2_) * sVar48;
                uVar58 = (sVar51 < (short)auVar42._12_2_) * auVar42._12_2_ |
                         (ushort)(sVar51 >= (short)auVar42._12_2_) * sVar51;
                uVar57 = (sVar54 < (short)auVar42._14_2_) * auVar42._14_2_ |
                         (ushort)(sVar54 >= (short)auVar42._14_2_) * sVar54;
                uVar47 = (-1 < (short)uVar47) * uVar47;
                uVar50 = (-1 < (short)uVar50) * uVar50;
                auVar65._2_2_ = uVar50;
                auVar65._0_2_ = uVar47;
                uVar53 = (-1 < (short)uVar53) * uVar53;
                auVar65._4_2_ = uVar53;
                uVar56 = (-1 < (short)uVar56) * uVar56;
                auVar65._6_2_ = uVar56;
                uVar28 = (-1 < (short)uVar28) * uVar28;
                auVar65._8_2_ = uVar28;
                uVar59 = (-1 < (short)uVar59) * uVar59;
                auVar65._10_2_ = uVar59;
                uVar58 = (-1 < (short)uVar58) * uVar58;
                auVar65._12_2_ = uVar58;
                uVar57 = (-1 < (short)uVar57) * uVar57;
                auVar65._14_2_ = uVar57;
                *(undefined1 (*) [16])((long)*b_00 + lVar18) = auVar65;
                piVar6 = ((ppVar11->field_4).rowcols)->score_row;
                *(uint *)((long)piVar6 + lVar17) = (uint)uVar47;
                *(uint *)((long)piVar6 + lVar23 * 4 + lVar17) = (uint)uVar50;
                *(uint *)((long)piVar6 + lVar23 * 8 + lVar17) = (uint)uVar53;
                *(uint *)((long)piVar6 + lVar23 * 0xc + lVar17) = (uint)uVar56;
                *(uint *)((long)piVar6 + lVar23 * 0x10 + lVar17) = (uint)uVar28;
                *(uint *)((long)piVar6 + lVar23 * 0x14 + lVar17) = (uint)uVar59;
                *(uint *)((long)piVar6 + lVar23 * 0x18 + lVar17) = (uint)uVar58;
                *(uint *)((long)piVar6 + lVar23 * 0x1c + lVar17) = (uint)uVar57;
                uVar108 = ((short)uVar47 < (short)uVar108) * uVar47 |
                          ((short)uVar47 >= (short)uVar108) * uVar108;
                uVar109 = ((short)uVar50 < (short)uVar109) * uVar50 |
                          ((short)uVar50 >= (short)uVar109) * uVar109;
                uVar110 = ((short)uVar53 < (short)uVar110) * uVar53 |
                          ((short)uVar53 >= (short)uVar110) * uVar110;
                uVar111 = ((short)uVar56 < (short)uVar111) * uVar56 |
                          ((short)uVar56 >= (short)uVar111) * uVar111;
                uVar112 = ((short)uVar28 < (short)uVar112) * uVar28 |
                          ((short)uVar28 >= (short)uVar112) * uVar112;
                uVar113 = ((short)uVar59 < (short)uVar113) * uVar59 |
                          ((short)uVar59 >= (short)uVar113) * uVar113;
                uVar114 = ((short)uVar58 < (short)uVar114) * uVar58 |
                          ((short)uVar58 >= (short)uVar114) * uVar114;
                uVar115 = ((short)uVar57 < (short)uVar115) * uVar57 |
                          ((short)uVar57 >= (short)uVar115) * uVar115;
                uVar99 = ((short)uVar99 < (short)uVar47) * uVar47 |
                         ((short)uVar99 >= (short)uVar47) * uVar99;
                uVar101 = ((short)uVar101 < (short)uVar50) * uVar50 |
                          ((short)uVar101 >= (short)uVar50) * uVar101;
                uVar102 = ((short)uVar102 < (short)uVar53) * uVar53 |
                          ((short)uVar102 >= (short)uVar53) * uVar102;
                uVar103 = ((short)uVar103 < (short)uVar56) * uVar56 |
                          ((short)uVar103 >= (short)uVar56) * uVar103;
                uVar104 = ((short)uVar104 < (short)uVar28) * uVar28 |
                          ((short)uVar104 >= (short)uVar28) * uVar104;
                uVar105 = ((short)uVar105 < (short)uVar59) * uVar59 |
                          ((short)uVar105 >= (short)uVar59) * uVar105;
                uVar106 = ((short)uVar106 < (short)uVar58) * uVar58 |
                          ((short)uVar106 >= (short)uVar58) * uVar106;
                uVar107 = ((short)uVar107 < (short)uVar57) * uVar57 |
                          ((short)uVar107 >= (short)uVar57) * uVar107;
                uVar89 = ((short)uVar89 < (short)uVar47) * uVar47 |
                         ((short)uVar89 >= (short)uVar47) * uVar89;
                uVar91 = ((short)uVar91 < (short)uVar50) * uVar50 |
                         ((short)uVar91 >= (short)uVar50) * uVar91;
                uVar92 = ((short)uVar92 < (short)uVar53) * uVar53 |
                         ((short)uVar92 >= (short)uVar53) * uVar92;
                uVar93 = ((short)uVar93 < (short)uVar56) * uVar56 |
                         ((short)uVar93 >= (short)uVar56) * uVar93;
                uVar94 = ((short)uVar94 < (short)uVar28) * uVar28 |
                         ((short)uVar94 >= (short)uVar28) * uVar94;
                uVar95 = ((short)uVar95 < (short)uVar59) * uVar59 |
                         ((short)uVar95 >= (short)uVar59) * uVar95;
                uVar96 = ((short)uVar96 < (short)uVar58) * uVar58 |
                         ((short)uVar96 >= (short)uVar58) * uVar96;
                uVar97 = ((short)uVar97 < (short)uVar57) * uVar57 |
                         ((short)uVar97 >= (short)uVar57) * uVar97;
                lVar18 = lVar18 + 0x10;
                lVar17 = lVar17 + uVar16 * 4;
              } while (lVar20 != lVar18);
              auVar43._0_2_ = -(ushort)((short)local_78 < (short)uVar89);
              auVar43._2_2_ = -(ushort)((short)uStack_76 < (short)uVar91);
              auVar43._4_2_ = -(ushort)((short)uVar30 < (short)uVar92);
              auVar43._6_2_ = -(ushort)((short)uVar49 < (short)uVar93);
              auVar43._8_2_ = -(ushort)((short)uVar52 < (short)uVar94);
              auVar43._10_2_ = -(ushort)((short)uVar55 < (short)uVar95);
              auVar43._12_2_ = -(ushort)((short)uVar70 < (short)uVar96);
              auVar43._14_2_ = -(ushort)((short)uVar71 < (short)uVar97);
              if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43._14_2_ >> 7 & 1) != 0) || (auVar43._14_2_ & 0x8000) != 0) {
                uVar30 = ((short)uVar94 < (short)uVar89) * uVar89 |
                         ((short)uVar94 >= (short)uVar89) * uVar94;
                uVar49 = ((short)uVar95 < (short)uVar91) * uVar91 |
                         ((short)uVar95 >= (short)uVar91) * uVar95;
                uVar52 = ((short)uVar96 < (short)uVar92) * uVar92 |
                         ((short)uVar96 >= (short)uVar92) * uVar96;
                uVar55 = ((short)uVar97 < (short)uVar93) * uVar93 |
                         ((short)uVar97 >= (short)uVar93) * uVar97;
                sVar85 = (0 < (short)uVar94) * uVar94;
                sVar61 = (0 < (short)uVar95) * uVar95;
                sVar87 = (0 < (short)uVar96) * uVar96;
                sVar86 = (0 < (short)uVar97) * uVar97;
                uVar30 = ((short)uVar52 < (short)uVar30) * uVar30 |
                         ((short)uVar52 >= (short)uVar30) * uVar52;
                uVar49 = ((short)uVar55 < (short)uVar49) * uVar49 |
                         ((short)uVar55 >= (short)uVar49) * uVar55;
                uVar52 = (sVar85 < (short)uVar52) * uVar52 |
                         (ushort)(sVar85 >= (short)uVar52) * sVar85;
                uVar55 = (sVar61 < (short)uVar55) * uVar55 |
                         (ushort)(sVar61 >= (short)uVar55) * sVar61;
                uVar70 = (ushort)(sVar87 < sVar85) * sVar85 | (ushort)(sVar87 >= sVar85) * sVar87;
                uVar71 = (ushort)(sVar86 < sVar61) * sVar61 | (ushort)(sVar86 >= sVar61) * sVar86;
                sVar87 = (ushort)(0 < sVar87) * sVar87;
                sVar86 = (ushort)(0 < sVar86) * sVar86;
                auVar44._0_4_ =
                     CONCAT22(((short)uVar52 < (short)uVar49) * uVar49 |
                              ((short)uVar52 >= (short)uVar49) * uVar52,
                              ((short)uVar49 < (short)uVar30) * uVar30 |
                              ((short)uVar49 >= (short)uVar30) * uVar49);
                auVar44._4_2_ =
                     ((short)uVar55 < (short)uVar52) * uVar52 |
                     ((short)uVar55 >= (short)uVar52) * uVar55;
                auVar44._6_2_ =
                     ((short)uVar70 < (short)uVar55) * uVar55 |
                     ((short)uVar70 >= (short)uVar55) * uVar70;
                auVar44._8_2_ =
                     ((short)uVar71 < (short)uVar70) * uVar70 |
                     ((short)uVar71 >= (short)uVar70) * uVar71;
                auVar44._10_2_ =
                     (sVar87 < (short)uVar71) * uVar71 | (ushort)(sVar87 >= (short)uVar71) * sVar87;
                auVar44._12_2_ =
                     (ushort)(sVar86 < sVar87) * sVar87 | (ushort)(sVar86 >= sVar87) * sVar86;
                auVar44._14_2_ = (ushort)(0 < sVar86) * sVar86;
                auVar33 = pshuflw(auVar44,auVar44,0);
                memcpy(__dest,b_00,size << 4);
                local_78 = auVar33._0_2_;
                uStack_76 = auVar33._2_2_;
                local_194 = (int)uVar22;
                uVar30 = local_78;
                uVar49 = uStack_76;
                uVar52 = local_78;
                uVar55 = uStack_76;
                uVar70 = local_78;
                uVar71 = uStack_76;
                local_1b4 = auVar44._0_4_;
              }
              uVar22 = uVar22 + 1;
              lVar24 = lVar24 + 4;
            } while (uVar22 != uVar16);
            bVar27 = (uVar19 & 0x7ffffff8) == 0;
            sVar61 = (short)local_1b4;
            if (!bVar27) {
              if (bVar27) {
                uVar19 = 0;
                do {
                  if ((*(short *)((long)*__dest + uVar19 * 2) == sVar61) &&
                     (uVar62 = ((uint)uVar19 & 7) * uVar25 | (uint)(uVar19 >> 3) & 0x1fffffff,
                     (int)uVar62 < (int)uVar15)) {
                    uVar15 = (ulong)uVar62;
                  }
                  uVar62 = (uint)uVar15;
                  uVar19 = uVar19 + 1;
                } while ((uVar25 & 0xfffffff) << 3 != (int)uVar19);
              }
              else {
                auVar45._4_4_ = uVar62;
                auVar45._0_4_ = uVar62;
                auVar45._8_4_ = uVar62;
                auVar45._12_4_ = uVar62;
                auVar33 = pshuflw(ZEXT416(local_1b4),ZEXT416(local_1b4),0);
                uVar15 = 0;
                auVar75 = _DAT_00904a60;
                do {
                  uVar3 = *(undefined8 *)((long)*__dest + uVar15 * 2);
                  auVar84._0_2_ = -(ushort)((short)uVar3 == auVar33._0_2_);
                  sVar85 = -(ushort)((short)((ulong)uVar3 >> 0x10) == auVar33._2_2_);
                  sVar86 = -(ushort)((short)((ulong)uVar3 >> 0x20) == auVar33._4_2_);
                  sVar87 = -(ushort)((short)((ulong)uVar3 >> 0x30) == auVar33._6_2_);
                  auVar84._8_8_ =
                       (undefined8)
                       (CONCAT64(CONCAT42(CONCAT22(sVar87,sVar87),sVar86),CONCAT22(sVar86,sVar87))
                       >> 0x10);
                  auVar84._6_2_ = sVar85;
                  auVar84._4_2_ = sVar85;
                  auVar84._2_2_ = auVar84._0_2_;
                  uVar62 = auVar75._4_4_;
                  uVar10 = auVar75._8_4_;
                  uVar13 = auVar75._12_4_;
                  auVar34 = auVar75 & _DAT_00904b30;
                  iVar12 = auVar34._4_4_;
                  auVar98._4_4_ = iVar12;
                  auVar98._0_4_ = iVar12;
                  auVar98._8_4_ = auVar34._12_4_;
                  auVar98._12_4_ = auVar34._12_4_;
                  auVar90._0_4_ = auVar34._0_4_ * uVar25 + (auVar75._0_4_ >> 3);
                  auVar90._4_4_ = iVar12 * uVar25 + (uVar62 >> 3);
                  auVar90._8_4_ = (int)((auVar34._8_8_ & 0xffffffff) * size) + (uVar10 >> 3);
                  auVar90._12_4_ = (int)((auVar98._8_8_ & 0xffffffff) * size) + (uVar13 >> 3);
                  auVar88._0_4_ = -(uint)(auVar90._0_4_ < auVar45._0_4_);
                  auVar88._4_4_ = -(uint)(auVar90._4_4_ < auVar45._4_4_);
                  auVar88._8_4_ = -(uint)(auVar90._8_4_ < auVar45._8_4_);
                  auVar88._12_4_ = -(uint)(auVar90._12_4_ < auVar45._12_4_);
                  auVar45 = ~auVar84 & auVar45 | (~auVar88 & auVar45 | auVar90 & auVar88) & auVar84;
                  uVar15 = uVar15 + 4;
                  auVar75._0_4_ = auVar75._0_4_ + 4;
                  auVar75._4_4_ = uVar62 + 4;
                  auVar75._8_4_ = uVar10 + 4;
                  auVar75._12_4_ = uVar13 + 4;
                } while (uVar26 != uVar15);
                auVar66._0_8_ = auVar45._8_8_;
                auVar66._8_4_ = auVar45._8_4_;
                auVar66._12_4_ = auVar45._12_4_;
                auVar73._0_4_ = -(uint)(auVar45._0_4_ < auVar45._8_4_);
                auVar73._4_4_ = -(uint)(auVar45._4_4_ < auVar45._12_4_);
                auVar73._8_8_ = 0;
                auVar33 = ~auVar73 & auVar66 | auVar45 & auVar73;
                uVar26 = auVar33._0_4_;
                uVar10 = auVar33._4_4_;
                uVar62 = -(uint)((int)uVar26 < (int)uVar10);
                uVar62 = ~uVar62 & uVar10 | uVar26 & uVar62;
              }
            }
            auVar46._0_2_ = -(ushort)((short)uVar108 < (short)local_148);
            auVar46._2_2_ = -(ushort)((short)uVar109 < (short)uStack_146);
            auVar46._4_2_ = -(ushort)((short)uVar110 < (short)local_148);
            auVar46._6_2_ = -(ushort)((short)uVar111 < (short)uStack_146);
            auVar46._8_2_ = -(ushort)((short)uVar112 < (short)local_148);
            auVar46._10_2_ = -(ushort)((short)uVar113 < (short)uStack_146);
            auVar46._12_2_ = -(ushort)((short)uVar114 < (short)local_148);
            auVar46._14_2_ = -(ushort)((short)uVar115 < (short)uStack_146);
            auVar100._0_2_ = -(ushort)((short)local_c8 < (short)uVar99);
            auVar100._2_2_ = -(ushort)((short)uStack_c6 < (short)uVar101);
            auVar100._4_2_ = -(ushort)((short)local_c8 < (short)uVar102);
            auVar100._6_2_ = -(ushort)((short)uStack_c6 < (short)uVar103);
            auVar100._8_2_ = -(ushort)((short)local_c8 < (short)uVar104);
            auVar100._10_2_ = -(ushort)((short)uStack_c6 < (short)uVar105);
            auVar100._12_2_ = -(ushort)((short)local_c8 < (short)uVar106);
            auVar100._14_2_ = -(ushort)((short)uStack_c6 < (short)uVar107);
            auVar100 = auVar100 | auVar46;
            if ((((((((((((((((auVar100 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar100 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar100 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar100 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar100 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar100 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar100 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar100 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar100 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar100 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar100 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar100 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar100[0xf] < '\0') {
              *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
              sVar61 = 0;
              local_194 = 0;
              uVar62 = 0;
            }
            ppVar11->score = (int)sVar61;
            ppVar11->end_query = uVar62;
            ppVar11->end_ref = local_194;
            parasail_free(ptr_00);
            parasail_free(__dest);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar11;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}